

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

void __thiscall Fl_Text_Display::calc_last_char(Fl_Text_Display *this)

{
  bool bVar1;
  int local_28;
  int local_14;
  int i;
  Fl_Text_Display *this_local;
  
  local_14 = this->mNVisibleLines;
  do {
    local_14 = local_14 + -1;
    bVar1 = false;
    if (-1 < local_14) {
      bVar1 = this->mLineStarts[local_14] == -1;
    }
  } while (bVar1);
  if (local_14 < 0) {
    local_28 = 0;
  }
  else {
    local_28 = line_end(this,this->mLineStarts[local_14],true);
  }
  this->mLastChar = local_28;
  return;
}

Assistant:

void Fl_Text_Display::calc_last_char() {
  int i;
  for (i = mNVisibleLines - 1; i >= 0 && mLineStarts[i] == -1; i--) ;
  mLastChar = i < 0 ? 0 : line_end(mLineStarts[i], true);
}